

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void boost::deflate::deflate_stream_test::testWrappedStream(void)

{
  anon_class_8_1_ba1d7388 test;
  string raw;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw,"This is fake content",(allocator<char> *)&test);
  test.raw = &raw;
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&test,none);
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&test,zlib);
  testWrappedStream::anon_class_8_1_ba1d7388::operator()(&test,gzip);
  std::__cxx11::string::~string((string *)&raw);
  return;
}

Assistant:

static void testWrappedStream(){
        std::string raw = "This is fake content";
        auto test = [&](wrap wrap){
            std::string compr;
            compr.resize(raw.size());
            auto ds = deflate_stream();
            ds.reset(6, 15, 8, Strategy::normal, wrap);
            z_params zp{};
            zp.next_in = raw.c_str();
            zp.avail_in = raw.size();
            zp.next_out = &compr[0];
            zp.avail_out = compr.size();

            error_code ec;
            ds.write(zp, Flush::full, ec);
            BOOST_TEST(!ec);
            BOOST_TEST(decompress(compr) == raw);
        };
        test(boost::deflate::wrap::none);
        test(boost::deflate::wrap::zlib);
        test(boost::deflate::wrap::gzip);
    }